

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O0

uint32_t ans_smsb_undo_mapping(dec_entry_smsb *entry,uint8_t **in_u8)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  long *in_RSI;
  long in_RDI;
  uint32_t *except_u32;
  uint8_t *u32_ptr;
  uint32_t mapped_num;
  uint32_t except_bytes;
  size_type in_stack_ffffffffffffffc8;
  uint uVar5;
  
  uVar2 = *(uint *)(in_RDI + 8) >> 0x1e;
  uVar3 = *(uint *)(in_RDI + 8) & 0x3fffffff;
  uVar5 = *(uint *)(*in_RSI - (ulong)uVar2);
  pvVar4 = std::array<unsigned_int,_4UL>::operator[]
                     ((array<unsigned_int,_4UL> *)
                      (CONCAT44(*(uint *)(in_RDI + 8),uVar5) & 0x3fffffffffffffff),
                      in_stack_ffffffffffffffc8);
  uVar1 = *pvVar4;
  *in_RSI = *in_RSI - (ulong)uVar2;
  return uVar3 + (uVar5 & uVar1);
}

Assistant:

inline uint32_t ans_smsb_undo_mapping(
    const dec_entry_smsb& entry, const uint8_t*& in_u8)
{
    uint32_t except_bytes = entry.mapped_num >> 30;
    uint32_t mapped_num = entry.mapped_num & 0x3FFFFFFF;
    static std::array<uint32_t, 4> except_mask
        = { 0x0, 0xFF, 0xFFFF, 0xFFFFFF };
    auto u32_ptr = in_u8 - except_bytes;
    auto except_u32 = reinterpret_cast<const uint32_t*>(u32_ptr);
    mapped_num = mapped_num + (*except_u32 & except_mask[except_bytes]);
    in_u8 -= except_bytes;
    return mapped_num;
}